

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx__vsnprintf_callback(char *buff,void *user,int len)

{
  int increment;
  void *pvVar1;
  int len_;
  sx__printf_ctx *ctx;
  int len_local;
  void *user_local;
  char *buff_local;
  
  increment = len + 1;
  if ((*(long *)((long)user + 8) == 0) ||
     (*(int *)(*(long *)((long)user + 8) + -8) <=
      *(int *)(*(long *)((long)user + 8) + -4) + increment)) {
    pvVar1 = sx__sbgrowf(*(void **)((long)user + 8),increment,1,*user,
                         "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                         ,"sx__vsnprintf_callback",0x45);
    *(void **)((long)user + 8) = pvVar1;
  }
  *(int *)(*(long *)((long)user + 8) + -4) = increment + *(int *)(*(long *)((long)user + 8) + -4);
  memcpy((void *)(*(long *)((long)user + 8) + (long)*(int *)((long)user + 0x10)),
         (void *)((long)user + 0x14),(long)len);
  *(int *)((long)user + 0x10) = len + *(int *)((long)user + 0x10);
  return (char *)((long)user + 0x14);
}

Assistant:

static char* sx__vsnprintf_callback(char* buff, void* user, int len)
{
    sx_unused(buff);
    sx__printf_ctx* ctx = (sx__printf_ctx*)user;
    int len_ = len + 1;    // Reserve one character for null-termination
    sx_array_add(ctx->alloc, ctx->buff, len_);
    sx_memcpy(ctx->buff + ctx->len, ctx->tmp, len);
    ctx->len += len;
    return ctx->tmp;
}